

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UBool __thiscall
icu_63::UnicodeString::padTrailing(UnicodeString *this,int32_t targetLength,UChar padChar)

{
  UBool UVar1;
  int32_t iVar2;
  char16_t *pcVar3;
  int local_34;
  int32_t length;
  UChar *array;
  int32_t oldLength;
  UChar padChar_local;
  int32_t targetLength_local;
  UnicodeString *this_local;
  
  iVar2 = UnicodeString::length(this);
  if ((iVar2 < targetLength) &&
     (UVar1 = cloneArrayIfNeeded(this,targetLength,-1,'\x01',(int32_t **)0x0,'\0'), UVar1 != '\0'))
  {
    pcVar3 = getArrayStart(this);
    local_34 = targetLength;
    while (local_34 = local_34 + -1, iVar2 <= local_34) {
      pcVar3[local_34] = padChar;
    }
    setLength(this,targetLength);
    return '\x01';
  }
  return '\0';
}

Assistant:

UBool 
UnicodeString::padTrailing(int32_t targetLength,
                           UChar padChar)
{
  int32_t oldLength = length();
  if(oldLength >= targetLength || !cloneArrayIfNeeded(targetLength)) {
    return FALSE;
  } else {
    // fill in padding character
    UChar *array = getArrayStart();
    int32_t length = targetLength;
    while(--length >= oldLength) {
      array[length] = padChar;
    }
    setLength(targetLength);
    return TRUE;
  }
}